

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSession.cpp
# Opt level: O2

void __thiscall tiger::trains::network::TCPSession::logout(TCPSession *this)

{
  size_t in_RCX;
  int __fd;
  int in_R8D;
  char sendBuffer [8];
  TCPClient local_40;
  
  __fd = (int)sendBuffer;
  sendBuffer[0] = '\x02';
  sendBuffer[1] = '\0';
  sendBuffer[2] = '\0';
  sendBuffer[3] = '\0';
  sendBuffer[4] = '\0';
  sendBuffer[5] = '\0';
  sendBuffer[6] = '\0';
  sendBuffer[7] = '\0';
  send(this,(int)sendBuffer,(void *)0x8,in_RCX,in_R8D);
  TCPClient::close(&this->tcpClient,__fd);
  TCPClient::TCPClient(&local_40);
  *(undefined4 *)((this->tcpClient).tcpSocket.clientSockAddr.sin_zero + 4) =
       local_40.tcpSocket.clientSockAddr.sin_zero._4_4_;
  *(undefined8 *)((this->tcpClient).tcpSocket.serverSockAddr.sin_zero + 4) =
       local_40.tcpSocket._16_8_;
  (this->tcpClient).tcpSocket.clientSockAddr.sin_addr =
       (in_addr)local_40.tcpSocket.clientSockAddr.sin_addr.s_addr;
  (this->tcpClient).tcpSocket.clientSockAddr.sin_zero[0] =
       local_40.tcpSocket.clientSockAddr.sin_zero[0];
  (this->tcpClient).tcpSocket.clientSockAddr.sin_zero[1] =
       local_40.tcpSocket.clientSockAddr.sin_zero[1];
  (this->tcpClient).tcpSocket.clientSockAddr.sin_zero[2] =
       local_40.tcpSocket.clientSockAddr.sin_zero[2];
  (this->tcpClient).tcpSocket.clientSockAddr.sin_zero[3] =
       local_40.tcpSocket.clientSockAddr.sin_zero[3];
  (this->tcpClient).tcpSocket.pSocket = local_40.tcpSocket.pSocket;
  (this->tcpClient).tcpSocket.serverSockAddr.sin_family =
       local_40.tcpSocket.serverSockAddr.sin_family;
  (this->tcpClient).tcpSocket.serverSockAddr.sin_port = local_40.tcpSocket.serverSockAddr.sin_port;
  (this->tcpClient).tcpSocket.serverSockAddr.sin_addr =
       (in_addr)local_40.tcpSocket.serverSockAddr.sin_addr.s_addr;
  (this->tcpClient).tcpSocket.serverSockAddr.sin_zero[0] =
       local_40.tcpSocket.serverSockAddr.sin_zero[0];
  (this->tcpClient).tcpSocket.serverSockAddr.sin_zero[1] =
       local_40.tcpSocket.serverSockAddr.sin_zero[1];
  (this->tcpClient).tcpSocket.serverSockAddr.sin_zero[2] =
       local_40.tcpSocket.serverSockAddr.sin_zero[2];
  (this->tcpClient).tcpSocket.serverSockAddr.sin_zero[3] =
       local_40.tcpSocket.serverSockAddr.sin_zero[3];
  TCPClient::~TCPClient(&local_40);
  return;
}

Assistant:

void TCPSession::logout()
{
    char sendBuffer[8];
    uint32_t cmd = 2;
    size_t len = 0;

    memcpy(sendBuffer, &cmd, 4);
    memcpy(sendBuffer + 4, &len, 4);
    send(sendBuffer, len + 8);

    tcpClient.close();
    tcpClient = TCPClient();
}